

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O2

Fl_Widget * __thiscall Fl_Tabs::value(Fl_Tabs *this)

{
  int iVar1;
  Fl_Widget **ppFVar2;
  Fl_Widget *pFVar3;
  long lVar4;
  Fl_Widget *pFVar5;
  long lStack_40;
  
  ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
  iVar1 = (this->super_Fl_Group).children_;
  lVar4 = 0;
  pFVar5 = (Fl_Widget *)0x0;
  do {
    if (iVar1 == (int)lVar4) {
      return pFVar5;
    }
    pFVar3 = ppFVar2[lVar4];
    lStack_40 = 0x30;
    if (pFVar5 == (Fl_Widget *)0x0) {
      if ((pFVar3->flags_ & 2) != 0) {
        lStack_40 = 0x28;
        pFVar5 = pFVar3;
        if (iVar1 + -1 == (int)lVar4) goto LAB_001ca34b;
        pFVar3 = (Fl_Widget *)0x0;
      }
    }
    else {
LAB_001ca34b:
      (**(code **)((long)pFVar3->_vptr_Fl_Widget + lStack_40))();
      pFVar3 = pFVar5;
    }
    lVar4 = lVar4 + 1;
    pFVar5 = pFVar3;
  } while( true );
}

Assistant:

Fl_Widget* Fl_Tabs::value() {
  Fl_Widget* v = 0;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (v) o->hide();
    else if (o->visible()) v = o;
    else if (!i) {o->show(); v = o;}
  }
  return v;
}